

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void dialer_reap(void *arg)

{
  nni_list *list;
  nni_mtx *mtx;
  nni_sock *s;
  int iVar1;
  nni_pipe *p;
  
  s = *(nni_sock **)((long)arg + 0x80);
  nni_stat_unregister((nni_stat_item *)((long)arg + 0x550));
  mtx = &s->s_mx;
  nni_mtx_lock(mtx);
  list = (nni_list *)((long)arg + 0xc0);
  iVar1 = nni_list_empty(list);
  if (iVar1 != 0) {
    nni_mtx_unlock(mtx);
    nni_sock_rele(s);
    nni_dialer_destroy((nni_dialer *)arg);
    return;
  }
  for (p = (nni_pipe *)nni_list_first(list); p != (nni_pipe *)0x0;
      p = (nni_pipe *)nni_list_next(list,p)) {
    nni_pipe_close(p);
  }
  nni_mtx_unlock(mtx);
  nni_reap(&dialer_reap_list,arg);
  return;
}

Assistant:

static void
dialer_reap(void *arg)
{
	nni_dialer *d = arg;
	nni_sock   *s = d->d_sock;

#ifdef NNG_ENABLE_STATS
	nni_stat_unregister(&d->st_root);
#endif

	nni_mtx_lock(&s->s_mx);
	if (!nni_list_empty(&d->d_pipes)) {
		nni_pipe *p;
		// This should already have been done, but be certain!
		NNI_LIST_FOREACH (&d->d_pipes, p) {
			nni_pipe_close(p);
		}
		nni_mtx_unlock(&s->s_mx);
		// Go back to the end of reap list.
		nni_dialer_reap(d);
		return;
	}

	nni_mtx_unlock(&s->s_mx);

	nni_sock_rele(s);

	nni_dialer_destroy(d);
}